

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object3D.cpp
# Opt level: O2

bool __thiscall Torus::intersect(Torus *this,Ray *r,float tmin,Hit *h)

{
  float fVar1;
  float fVar2;
  Material *pMVar3;
  float *pfVar4;
  DComplex *pDVar5;
  long lVar6;
  Ray *pRVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float extraout_XMM0_Da;
  float fVar11;
  double dVar12;
  double dVar13;
  float fVar14;
  float fVar15;
  double dVar16;
  Vector3f normal;
  Vector3f point;
  Vector3f ray_org;
  Vector3f ray_dir;
  
  Vector3f::Vector3f(&ray_dir,&r->_direction);
  Vector3f::Vector3f(&ray_org,&r->_origin);
  fVar8 = Vector3f::absSquared(&ray_dir);
  fVar9 = Vector3f::absSquared(&ray_org);
  fVar10 = (fVar9 - this->_r * this->_r) - this->_R * this->_R;
  fVar9 = Vector3f::dot(&ray_org,&ray_dir);
  fVar14 = this->_R * 4.0 * this->_R;
  dVar16 = (double)fVar8;
  dVar13 = (double)(fVar8 * fVar8);
  dVar12 = (double)fVar9;
  pfVar4 = Vector3f::operator[](&ray_dir,1);
  fVar8 = *pfVar4;
  pfVar4 = Vector3f::operator[](&ray_dir,1);
  fVar9 = *pfVar4;
  pfVar4 = Vector3f::operator[](&ray_dir,1);
  fVar15 = *pfVar4;
  pfVar4 = Vector3f::operator[](&ray_org,1);
  fVar1 = *pfVar4;
  fVar11 = this->_r;
  pfVar4 = Vector3f::operator[](&ray_org,1);
  fVar2 = *pfVar4;
  pfVar4 = Vector3f::operator[](&ray_org,1);
  pDVar5 = solve_quartic((dVar16 * 4.0 * dVar12) / dVar13,
                         ((double)(fVar8 * fVar14 * fVar9) +
                         (dVar16 + dVar16) * (double)fVar10 + dVar12 * dVar12 * 4.0) / dVar13,
                         (dVar12 * 4.0 * (double)fVar10 +
                         (double)fVar1 * (double)fVar15 * ((double)fVar14 + (double)fVar14)) /
                         dVar13,(double)(fVar10 * fVar10 -
                                        (fVar11 * fVar11 - fVar2 * *pfVar4) * fVar14) / dVar13);
  fVar8 = h->t;
  fVar9 = fVar8;
  for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 0x10) {
    if ((((int)*(double *)(pDVar5->_M_value + lVar6 + 8) == 0) &&
        (fVar15 = (float)*(double *)(pDVar5->_M_value + lVar6), fVar15 < fVar9)) && (tmin < fVar15))
    {
      fVar9 = fVar15;
    }
  }
  if (fVar9 < fVar8) {
    Ray::pointAtParameter((Ray *)&point,fVar9);
    fVar15 = this->_R;
    pRVar7 = (Ray *)&point;
    Vector3f::xz(&normal);
    Vector2f::abs((Vector2f *)&normal,(int)pRVar7);
    fVar11 = 1.0 - fVar15 / extraout_XMM0_Da;
    pfVar4 = Vector3f::operator[](&point,0);
    fVar15 = *pfVar4;
    pfVar4 = Vector3f::operator[](&point,1);
    fVar1 = *pfVar4;
    pfVar4 = Vector3f::operator[](&point,2);
    Vector3f::Vector3f(&normal,fVar15 * fVar11,fVar1,fVar11 * *pfVar4);
    Vector3f::normalize(&normal);
    pMVar3 = (this->super_Object3D).material;
    h->t = fVar9;
    h->material = pMVar3;
    Vector3f::operator=(&h->normal,&normal);
  }
  return fVar9 < fVar8;
}

Assistant:

bool Torus::intersect(const Ray &r, float tmin, Hit &h) const {
    // method adapted from https://github.com/sasamil/Quartic
    // and http://www.cosinekitty.com/raytrace/chapter13_torus.html
    Vector3f ray_dir = r.getDirection();
    Vector3f ray_org = r.getOrigin();

    float sum_d_sqrd = ray_dir.absSquared();
    float e = ray_org.absSquared() - _r * _r - _R * _R;
    float f = Vector3f::dot(ray_org, ray_dir);
    float four_a_sqrd = 4.f * _R * _R;

    double z = sum_d_sqrd * sum_d_sqrd; // x^4
    double a = 4. * sum_d_sqrd * f; // x^3
    double b = 2. * sum_d_sqrd * e + 4. * f * f + four_a_sqrd * ray_dir[1] * ray_dir[1]; // x^2
    double c = 4. * f * e + 2. * four_a_sqrd * ray_dir[1] * ray_org[1];
    double d = e * e - four_a_sqrd * (_r * _r - ray_org[1] * ray_org[1]);

    a /= z;
    b /= z;
    c /= z;
    d /= z;

    std::complex<double> *solutions = solve_quartic(a, b, c, d);

    // find closest solution
    std::complex<double> solution;
    float t_min = h.getT();
    float t_guess;
    float imag_eps = 0.;
    for (int i = 0; i < 4; i++) {
        solution = solutions[i];

        if (abs(solution.imag()) > imag_eps) {
            continue;
        }

        t_guess = (float) solution.real();

        if ((t_guess < t_min) && (t_guess > tmin)) {
            t_min = t_guess;
        }
    }

    // check that it is the closest hit so far
    if (t_min < h.getT()) {
        Vector3f point = r.pointAtParameter(t_min);

        float alpha = _R / point.xz().abs();
        Vector3f normal((1 - alpha) * point[0], point[1], (1 - alpha) * point[2]);
        normal.normalize();

        h.set(t_min, this->material, normal);
        return true;
    }

    return false;
}